

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

Value * __thiscall Json::Value::find(Value *this,char *begin,char *end)

{
  bool bVar1;
  ValueType VVar2;
  reference ppVar3;
  iterator local_200;
  _Rb_tree_const_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_> local_1f8;
  iterator local_1f0;
  _Rb_tree_const_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_> local_1e8;
  const_iterator it;
  CZString actualKey;
  ostringstream local_1a0 [8];
  OStringStream oss;
  int local_28;
  char *end_local;
  char *begin_local;
  Value *this_local;
  
  VVar2 = type(this);
  if (VVar2 != nullValue) {
    VVar2 = type(this);
    if (VVar2 != objectValue) {
      std::__cxx11::ostringstream::ostringstream(local_1a0);
      std::operator<<((ostream *)local_1a0,
                      "in Json::Value::find(begin, end): requires objectValue or nullValue");
      std::__cxx11::ostringstream::str();
      throwLogicError((String *)&actualKey.field_1.storage_);
    }
  }
  VVar2 = type(this);
  if (VVar2 == nullValue) {
    this_local = (Value *)0x0;
  }
  else {
    local_28 = (int)end;
    CZString::CZString((CZString *)&it,begin,local_28 - (int)begin,noDuplication);
    local_1f0._M_node =
         (_Base_ptr)
         std::
         map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
         ::find((this->value_).map_,(CZString *)&it);
    std::_Rb_tree_const_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>::
    _Rb_tree_const_iterator(&local_1e8,&local_1f0);
    local_200._M_node =
         (_Base_ptr)
         std::
         map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
         ::end((this->value_).map_);
    std::_Rb_tree_const_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>::
    _Rb_tree_const_iterator(&local_1f8,&local_200);
    bVar1 = std::operator==(&local_1e8,&local_1f8);
    if (bVar1) {
      this_local = (Value *)0x0;
    }
    else {
      ppVar3 = std::_Rb_tree_const_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>::
               operator*(&local_1e8);
      this_local = &ppVar3->second;
    }
    CZString::~CZString((CZString *)&it);
  }
  return this_local;
}

Assistant:

Value const* Value::find(char const* begin, char const* end) const {
  JSON_ASSERT_MESSAGE(type() == nullValue || type() == objectValue,
                      "in Json::Value::find(begin, end): requires "
                      "objectValue or nullValue");
  if (type() == nullValue)
    return nullptr;
  CZString actualKey(begin, static_cast<unsigned>(end - begin),
                     CZString::noDuplication);
  ObjectValues::const_iterator it = value_.map_->find(actualKey);
  if (it == value_.map_->end())
    return nullptr;
  return &(*it).second;
}